

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-test-part.cc
# Opt level: O2

void __thiscall
testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
          (HasNewFatalFailureHelper *this)

{
  TestPartResultReporterInterface *pTVar1;
  UnitTestImpl *pUVar2;
  TestPartResultReporterInterface **ppTVar3;
  
  (this->super_TestPartResultReporterInterface)._vptr_TestPartResultReporterInterface =
       (_func_int **)&PTR__HasNewFatalFailureHelper_00137420;
  pUVar2 = GetUnitTestImpl();
  pTVar1 = this->original_reporter_;
  ppTVar3 = ThreadLocal<testing::TestPartResultReporterInterface_*>::GetOrCreateValue
                      (&pUVar2->per_thread_test_part_result_reporter_);
  *ppTVar3 = pTVar1;
  return;
}

Assistant:

HasNewFatalFailureHelper::~HasNewFatalFailureHelper() {
  GetUnitTestImpl()->SetTestPartResultReporterForCurrentThread(
      original_reporter_);
}